

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O2

bool AppInitSanityChecks(Context *kernel)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  bilingual_str bStack_d8;
  bilingual_str local_98;
  Result<void> result;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ::kernel::SanityChecks(&result,kernel);
  if (result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_index == '\x01') {
    bVar2 = ECC_InitSanityCheck();
    if (bVar2) {
      bVar2 = LockDataDirectory(true);
      goto LAB_00156489;
    }
    _(&bStack_d8,(ConstevalStringLiteral)0x698d8b);
    tinyformat::format<char[13]>(&local_98,&bStack_d8,(char (*) [13])"Bitcoin Core");
    bVar2 = InitError(&local_98);
  }
  else {
    util::ErrorString<void>(&local_98,&result);
    InitError(&local_98);
    bilingual_str::~bilingual_str(&local_98);
    _(&bStack_d8,(ConstevalStringLiteral)0x698d45);
    tinyformat::format<char[13]>(&local_98,&bStack_d8,(char (*) [13])"Bitcoin Core");
    bVar2 = InitError(&local_98);
  }
  bilingual_str::~bilingual_str(&local_98);
  bilingual_str::~bilingual_str(&bStack_d8);
LAB_00156489:
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_std::monostate>::
  ~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::monostate> *)&result);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool AppInitSanityChecks(const kernel::Context& kernel)
{
    // ********************************************************* Step 4: sanity checks
    auto result{kernel::SanityChecks(kernel)};
    if (!result) {
        InitError(util::ErrorString(result));
        return InitError(strprintf(_("Initialization sanity check failed. %s is shutting down."), PACKAGE_NAME));
    }

    if (!ECC_InitSanityCheck()) {
        return InitError(strprintf(_("Elliptic curve cryptography sanity check failure. %s is shutting down."), PACKAGE_NAME));
    }

    // Probe the data directory lock to give an early error message, if possible
    // We cannot hold the data directory lock here, as the forking for daemon() hasn't yet happened,
    // and a fork will cause weird behavior to it.
    return LockDataDirectory(true);
}